

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeSorterJoinAll(VdbeSorter *pSorter,int rcin)

{
  int iVar1;
  SortSubtask *pTask;
  ulong uVar2;
  
  uVar2 = (ulong)pSorter->nTask;
  pTask = pSorter->aTask + (uVar2 - 1);
  while (0 < (long)uVar2) {
    uVar2 = uVar2 - 1;
    iVar1 = vdbeSorterJoinThread(pTask);
    if (rcin == 0) {
      rcin = iVar1;
    }
    pTask = pTask + -1;
  }
  return rcin;
}

Assistant:

static int vdbeSorterJoinAll(VdbeSorter *pSorter, int rcin){
  int rc = rcin;
  int i;

  /* This function is always called by the main user thread.
  **
  ** If this function is being called after SorterRewind() has been called, 
  ** it is possible that thread pSorter->aTask[pSorter->nTask-1].pThread
  ** is currently attempt to join one of the other threads. To avoid a race
  ** condition where this thread also attempts to join the same object, join 
  ** thread pSorter->aTask[pSorter->nTask-1].pThread first. */
  for(i=pSorter->nTask-1; i>=0; i--){
    SortSubtask *pTask = &pSorter->aTask[i];
    int rc2 = vdbeSorterJoinThread(pTask);
    if( rc==SQLITE_OK ) rc = rc2;
  }
  return rc;
}